

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ptr<Expression> __thiscall Parser::expression(Parser *this)

{
  pointer pcVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined4 uVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  undefined8 *puVar6;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  undefined **ppuVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  Parser *in_RSI;
  TokenType *type;
  TokenType *pTVar9;
  ptr<Expression> pVar10;
  initializer_list<TokenType> __l;
  ptr<Symbol> symbol;
  ptr<Operation> additionalOperation;
  undefined1 local_a9;
  vector<TokenType,_std::allocator<TokenType>_> local_a8;
  undefined1 local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  undefined4 uStack_78;
  undefined4 uStack_74;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  unsigned_long local_60;
  unsigned_long uStack_58;
  _Alloc_hider local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  disjunction(this);
  uStack_78 = 0x15;
  uStack_74 = 0x17;
  _Stack_70._vptr__Sp_counted_base._0_4_ = 0x16;
  local_88 = (undefined1  [8])0x1200000011;
  _Stack_80._M_pi._0_4_ = 0x14;
  _Stack_80._M_pi._4_4_ = 0x13;
  __l._M_len = 7;
  __l._M_array = (iterator)local_88;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector
            (&local_a8,__l,(allocator_type *)&local_48);
  _Var8._M_pi = extraout_RDX;
  pTVar9 = local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
           super__Vector_impl_data._M_start;
  while ((pTVar9 != local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                    super__Vector_impl_data._M_finish &&
         (bVar5 = match(in_RSI,*pTVar9), _Var8._M_pi = extraout_RDX_00, !bVar5))) {
    pTVar9 = pTVar9 + 1;
  }
  if (local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_start != (TokenType *)0x0) {
    operator_delete(local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl
                          .super__Vector_impl_data._M_start);
    _Var8._M_pi = extraout_RDX_01;
  }
  if (pTVar9 == local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                super__Vector_impl_data._M_finish) goto LAB_0010d9b0;
  pcVar1 = (this->filepath)._M_dataplus._M_p;
  if (pcVar1 == (pointer)0x0) {
    local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)__dynamic_cast(pcVar1,&Expression::typeinfo,&Symbol::typeinfo,0);
  }
  if (local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(this->filepath)._M_string_length;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
        super__Vector_impl_data._M_finish)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
             super__Vector_impl_data._M_finish)->_M_use_count + 1;
      }
    }
  }
  if (local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_start == (pointer)0x0) {
    error(in_RSI,"The left operand of the assignment operator is not an lvalue");
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        CONCAT44(_Stack_80._M_pi._4_4_,_Stack_80._M_pi._0_4_) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 CONCAT44(_Stack_80._M_pi._4_4_,_Stack_80._M_pi._0_4_));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
        super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
                 super__Vector_impl_data._M_finish);
    }
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->filepath)._M_string_length;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
    _Unwind_Resume(extraout_RAX);
  }
  local_88._0_4_ = (in_RSI->currentToken).type;
  pcVar1 = (in_RSI->currentToken).lexeme._M_dataplus._M_p;
  _Stack_80._M_pi = &_Stack_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&_Stack_80,pcVar1,pcVar1 + (in_RSI->currentToken).lexeme._M_string_length);
  local_60 = (in_RSI->currentToken).line;
  uStack_58 = (in_RSI->currentToken).col;
  uVar3 = local_88._0_4_;
  if (_Stack_80._M_pi != &_Stack_70) {
    operator_delete(_Stack_80._M_pi,
                    CONCAT44(_Stack_70._vptr__Sp_counted_base._4_4_,
                             _Stack_70._vptr__Sp_counted_base._0_4_) + 1);
  }
  consume(in_RSI);
  local_88 = (undefined1  [8])0x0;
  _Stack_80._M_pi._0_4_ = 0;
  _Stack_80._M_pi._4_4_ = 0;
  switch(uVar3) {
  case 0x12:
    puVar6 = (undefined8 *)operator_new(0x18);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_0012f3c8;
    local_88 = (undefined1  [8])(puVar6 + 2);
    ppuVar7 = &PTR_asStrings_0012f418;
    break;
  case 0x13:
    puVar6 = (undefined8 *)operator_new(0x18);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_0012f788;
    local_88 = (undefined1  [8])(puVar6 + 2);
    ppuVar7 = &PTR_asStrings_0012f7d8;
    break;
  case 0x14:
    puVar6 = (undefined8 *)operator_new(0x18);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_0012f6c8;
    local_88 = (undefined1  [8])(puVar6 + 2);
    ppuVar7 = &PTR_asStrings_0012f718;
    break;
  case 0x15:
    puVar6 = (undefined8 *)operator_new(0x18);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_0012f848;
    local_88 = (undefined1  [8])(puVar6 + 2);
    ppuVar7 = &PTR_asStrings_0012f898;
    break;
  case 0x16:
    puVar6 = (undefined8 *)operator_new(0x18);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_0012f9c8;
    local_88 = (undefined1  [8])(puVar6 + 2);
    ppuVar7 = &PTR_asStrings_0012fa18;
    break;
  case 0x17:
    puVar6 = (undefined8 *)operator_new(0x18);
    puVar6[1] = 0x100000001;
    *puVar6 = &PTR___Sp_counted_ptr_inplace_0012f908;
    local_88 = (undefined1  [8])(puVar6 + 2);
    ppuVar7 = &PTR_asStrings_0012f958;
    break;
  default:
    goto switchD_0010d7c3_default;
  }
  puVar6[2] = ppuVar7;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(_Stack_80._M_pi._4_4_,_Stack_80._M_pi._0_4_);
  _Stack_80._M_pi._0_4_ = SUB84(puVar6,0);
  _Stack_80._M_pi._4_4_ = (undefined4)((ulong)puVar6 >> 0x20);
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
switchD_0010d7c3_default:
  disjunction((Parser *)&stack0xffffffffffffffc8);
  local_48._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Assignment,std::allocator<Assignment>,std::shared_ptr<Operation>&,std::shared_ptr<Symbol>&,std::shared_ptr<Expression>&>
            (&_Stack_40,(Assignment **)&local_48,(allocator<Assignment> *)&local_a9,
             (shared_ptr<Operation> *)local_88,(shared_ptr<Symbol> *)&local_a8,
             (shared_ptr<Expression> *)&stack0xffffffffffffffc8);
  _Var8._M_pi = _Stack_40._M_pi;
  _Var4._M_p = local_48._M_p;
  local_48._M_p = (pointer)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(this->filepath)._M_string_length;
  (this->filepath)._M_dataplus._M_p = _Var4._M_p;
  (this->filepath)._M_string_length = (size_type)_Var8._M_pi;
  _Var8._M_pi = extraout_RDX_02;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    _Var8._M_pi = extraout_RDX_03;
  }
  if (_Stack_40._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
    _Var8._M_pi = extraout_RDX_04;
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
    _Var8._M_pi = extraout_RDX_05;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT44(_Stack_80._M_pi._4_4_,_Stack_80._M_pi._0_4_) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT44(_Stack_80._M_pi._4_4_,_Stack_80._M_pi._0_4_));
    _Var8._M_pi = extraout_RDX_06;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
      super__Vector_impl_data._M_finish != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_a8.super__Vector_base<TokenType,_std::allocator<TokenType>_>._M_impl.
               super__Vector_impl_data._M_finish);
    _Var8._M_pi = extraout_RDX_07;
  }
LAB_0010d9b0:
  pVar10.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  pVar10.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Expression>)pVar10.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Expression> Parser::expression() {
    ptr<Expression> expr = disjunction();

    if(matchAny({ TokenType::Assign, TokenType::PlusAssign, TokenType::MultAssign, TokenType::MinusAssign, TokenType::DivAssign, TokenType::ExpAssign, TokenType::ModAssign })) {
        // todo: Do a better symbol check!!!
        ptr<Symbol> symbol = std::dynamic_pointer_cast<Symbol>(expr);
        if(!symbol)
            error("The left operand of the assignment operator is not an lvalue");

        TokenType assignType = token().type;
        consume();
        ptr<Operation> additionalOperation;

        if(assignType == TokenType::PlusAssign)
            additionalOperation = make<Addition>();
        else if(assignType == TokenType::MultAssign)
            additionalOperation = make<Multiplication>();
        else if(assignType == TokenType::MinusAssign)
            additionalOperation = make<Subtraction>();
        else if(assignType == TokenType::DivAssign)
            additionalOperation = make<Division>();
        else if(assignType == TokenType::ExpAssign)
            additionalOperation = make<Exponentiation>();
        else if(assignType == TokenType::ModAssign)
            additionalOperation = make<Modulo>();

        expr = make<Assignment>(additionalOperation, symbol, disjunction());
    }

    return expr;
}